

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LUX_Run03.hh
# Opt level: O3

double __thiscall
DetectorExample_LUX_RUN03::FitS1
          (DetectorExample_LUX_RUN03 *this,double xPos_mm,double yPos_mm,double zPos_mm,LCE map)

{
  double __x;
  double dVar1;
  
  __x = SQRT(yPos_mm * yPos_mm + xPos_mm * xPos_mm);
  dVar1 = pow(__x,3.0);
  dVar1 = (dVar1 * SQRT(ABS(zPos_mm + -318.84)) * -1.1525e-07 +
          zPos_mm * zPos_mm * 0.0002257 + zPos_mm * -0.3071 + 307.9) / 307.9;
  if ((((dVar1 < 0.5) || (1.5 < dVar1)) || (NAN(dVar1))) && (__x < (this->super_VDetector).radmax))
  {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "ERR: S1 corrections exceed a 50% difference. Are you sure you didn\'t forget to change LUX numbers for your own detector??"
               ,0x79);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    dVar1 = 1.0;
  }
  return dVar1;
}

Assistant:

double FitS1(double xPos_mm, double yPos_mm, double zPos_mm,
               LCE map) override {
    double radius = sqrt(pow(xPos_mm, 2.) + pow(yPos_mm, 2.));
    double amplitude = 307.9 - 0.3071 * zPos_mm + 0.0002257 * pow(zPos_mm, 2.);
    double shape = 1.1525e-7 * sqrt(std::abs(zPos_mm - 318.84));
    double finalCorr = -shape * pow(radius, 3.) + amplitude;
    finalCorr /= 307.9;
    if ((finalCorr < 0.5 || finalCorr > 1.5 || std::isnan(finalCorr)) &&
        radius < radmax) {
      cerr << "ERR: S1 corrections exceed a 50% difference. Are you sure you "
              "didn't forget to change LUX numbers for your own detector??"
           << endl;
      return 1.;
    } else
      return finalCorr;
  }